

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.h
# Opt level: O3

int aom_get_qmlevel_luma_ssimulacra2(int qindex,int first,int last)

{
  int iVar1;
  
  iVar1 = 10;
  if ((((0x28 < qindex) && (iVar1 = 9, 0x3c < (uint)qindex)) && (iVar1 = 8, 100 < (uint)qindex)) &&
     (((iVar1 = 7, 0x78 < (uint)qindex && (iVar1 = 6, 0x8c < (uint)qindex)) &&
      ((iVar1 = 5, 0xa0 < (uint)qindex && (iVar1 = 4, 200 < (uint)qindex)))))) {
    iVar1 = ((uint)qindex < 0xdd) + 2;
  }
  if (iVar1 < last) {
    last = iVar1;
  }
  if (iVar1 < first) {
    last = first;
  }
  return last;
}

Assistant:

static inline int aom_get_qmlevel_luma_ssimulacra2(int qindex, int first,
                                                   int last) {
  int qm_level = 0;

  if (qindex <= 40) {
    qm_level = 10;
  } else if (qindex <= 60) {
    qm_level = 9;
  } else if (qindex <= 100) {
    qm_level = 8;
  } else if (qindex <= 120) {
    qm_level = 7;
  } else if (qindex <= 140) {
    qm_level = 6;
  } else if (qindex <= 160) {
    qm_level = 5;
  } else if (qindex <= 200) {
    qm_level = 4;
  } else if (qindex <= 220) {
    qm_level = 3;
  } else {
    qm_level = 2;
  }

  return clamp(qm_level, first, last);
}